

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_label.h
# Opt level: O2

result_type __thiscall
std::hash<label::JSONLabel>::operator()(hash<label::JSONLabel> *this,argument_type *s)

{
  size_t sVar1;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_71;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  operator+(&local_50,&s->label_,"hash");
  __cxx11::to_string(&local_70,s->type_);
  operator+(&local_30,&local_50,&local_70);
  sVar1 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()(&local_71,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return sVar1;
}

Assistant:

result_type operator()(argument_type const& s) const noexcept {
        result_type const h ( std::hash<std::string>{}(s.to_string() + "hash" + 
            std::to_string(s.get_type())) );
        return h;
    }